

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_process.c
# Opt level: O0

void invoke_server_state_cb(ares_server_t *server,ares_bool_t success,int flags)

{
  ares_channel_t *paVar1;
  ares_status_t aVar2;
  ares_buf_t *buf_00;
  char *ptr;
  char *server_string;
  ares_status_t status;
  ares_buf_t *buf;
  ares_channel_t *channel;
  int flags_local;
  ares_bool_t success_local;
  ares_server_t *server_local;
  
  paVar1 = server->channel;
  if ((paVar1->server_state_cb != (ares_server_state_callback)0x0) &&
     (buf_00 = ares_buf_create(), buf_00 != (ares_buf_t *)0x0)) {
    aVar2 = ares_get_server_addr(server,buf_00);
    if (aVar2 == ARES_SUCCESS) {
      ptr = ares_buf_finish_str(buf_00,(size_t *)0x0);
      if (ptr != (char *)0x0) {
        (*paVar1->server_state_cb)(ptr,success,flags,paVar1->server_state_cb_data);
        ares_free(ptr);
      }
    }
    else {
      ares_buf_destroy(buf_00);
    }
  }
  return;
}

Assistant:

static void invoke_server_state_cb(const ares_server_t *server,
                                   ares_bool_t success, int flags)
{
  const ares_channel_t *channel = server->channel;
  ares_buf_t           *buf;
  ares_status_t         status;
  char                 *server_string;

  if (channel->server_state_cb == NULL) {
    return;
  }

  buf = ares_buf_create();
  if (buf == NULL) {
    return; /* LCOV_EXCL_LINE: OutOfMemory */
  }

  status = ares_get_server_addr(server, buf);
  if (status != ARES_SUCCESS) {
    ares_buf_destroy(buf); /* LCOV_EXCL_LINE: OutOfMemory */
    return;                /* LCOV_EXCL_LINE: OutOfMemory */
  }

  server_string = ares_buf_finish_str(buf, NULL);
  buf           = NULL;
  if (server_string == NULL) {
    return; /* LCOV_EXCL_LINE: OutOfMemory */
  }

  channel->server_state_cb(server_string, success, flags,
                           channel->server_state_cb_data);
  ares_free(server_string);
}